

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Integer ma_nelem(Pointer address,ulongi length,Integer datatype)

{
  long in_RDX;
  ulong in_RSI;
  Pointer in_RDI;
  ulongi nbytes;
  Pointer client_space;
  AR ar;
  ulong local_40;
  Pointer local_38;
  AR local_30;
  ulong local_18;
  Pointer local_10;
  ulong local_8;
  
  if (in_RSI < 0x59) {
    local_8 = 0;
  }
  else {
    local_30.nelem = (in_RSI - 0x58) / (ulong)(long)ma_sizeof[in_RDX];
    local_18 = in_RSI;
    local_10 = in_RDI;
    while ((0 < local_30.nelem &&
           (balloc_after(&local_30,local_10,&local_38,&local_40), local_18 < local_40))) {
      local_30.nelem = local_30.nelem - 1;
    }
    local_8 = local_30.nelem;
  }
  return local_8;
}

Assistant:

private Integer ma_nelem(address, length, datatype)
    Pointer    address;    /* location of hypothetical block */
    ulongi    length;        /* length of hypothetical block */
    Integer    datatype;    /* of elements in hypothetical block */
{
    AR        ar;        /* allocation request */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */

    if (length <= BLOCK_OVERHEAD_FIXED)
        /* no point in computing anything */
        return (Integer)0;

    /* compute initial request */
    ar.datatype = datatype;
    ar.nelem = (length - BLOCK_OVERHEAD_FIXED) / ma_sizeof[datatype];

    /* make requests until one succeeds or we give up */
    while (ar.nelem > 0)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, address, &client_space, &nbytes);

        if (nbytes > length)
            /* not enough space for ar.nelem elements */
            ar.nelem--;
        else
            /* enough space for ar.nelem elements */
            break;
    }

    /* return the result */
    return ar.nelem;
}